

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigmund~.c
# Opt level: O1

void sigmund_getrawpeaks(int npts,t_float *insamps,int npeak,t_peak_conflict *peakv,int *nfound,
                        t_float *power,t_float srate,int loud,t_float hifreq)

{
  t_sample *ptVar1;
  t_sample tVar2;
  t_sample tVar3;
  t_sample tVar4;
  float fVar5;
  t_peak_conflict *peaks;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  t_sample *ptVar9;
  uint uVar10;
  t_sample *ptVar11;
  t_sample *ptVar12;
  t_sample *ptVar13;
  long lVar14;
  int loud_00;
  t_sample *ptVar15;
  t_sample *ptVar16;
  int npeak_00;
  ulong uVar17;
  double dVar18;
  ulong uVar19;
  long lVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  float fVar27;
  uint uVar28;
  uint uVar29;
  float fVar30;
  float fVar31;
  uint in_XMM9_Db;
  uint in_XMM9_Dc;
  uint in_XMM9_Dd;
  float local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  double local_e0;
  double local_d8;
  ulong local_d0;
  int *local_c8;
  ulong local_c0;
  t_peak_conflict *local_b8;
  t_sample *local_b0;
  t_sample *local_a8;
  ulong local_a0;
  undefined8 local_98;
  uint uStack_90;
  uint uStack_8c;
  float local_84;
  float local_80;
  uint local_7c;
  t_float *local_78;
  double local_70;
  long local_68;
  t_sample *local_60;
  undefined8 local_58;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  float local_34;
  
  ptVar11 = &local_f8;
  uVar17 = (ulong)(uint)npts;
  local_84 = 1.0 / (float)npts;
  local_70 = (double)local_84;
  local_34 = (float)((double)srate * 0.5 * local_70);
  local_7c = npts * 0x18 + 0x20;
  local_c0 = (ulong)local_7c;
  local_58 = (double)CONCAT44(local_58._4_4_,npts * 2);
  local_c8 = nfound;
  local_b8 = peakv;
  local_78 = power;
  local_48 = npeak;
  if ((int)local_7c < 400000) {
    ptVar11 = (t_sample *)((long)&local_f8 - ((long)(int)local_7c + 0xfU & 0xfffffffffffffff0));
    local_60 = ptVar11;
    iVar6 = npts * 2;
  }
  else {
    local_40 = CONCAT44(local_40._4_4_,hifreq);
    local_60 = (t_sample *)getbytes(local_c0);
    hifreq = (float)local_40;
    iVar6 = (int)(float)local_58;
  }
  local_44 = (int)(hifreq / local_34);
  if ((int)(npts - 4U) < (int)(hifreq / local_34)) {
    local_44 = npts - 4U;
  }
  local_68 = (long)iVar6;
  ptVar1 = local_60 + local_68;
  if (0 < npts) {
    ptVar11[-2] = 2.461096e-39;
    ptVar11[-1] = 0.0;
    memset(ptVar1,0,uVar17 * 4);
    iVar6 = (int)(float)local_58;
  }
  ptVar12 = local_60;
  dVar18 = (double)(long)npts;
  if (0 < npts) {
    uVar8 = 0;
    do {
      ptVar12[uVar8] = insamps[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar17 != uVar8);
  }
  if (npts < iVar6) {
    ptVar11[-2] = 2.461189e-39;
    ptVar11[-1] = 0.0;
    memset(ptVar12 + (long)dVar18,0,(ulong)(npts - 1) * 4 + 4);
    ptVar12 = local_60;
    iVar6 = (int)(float)local_58;
  }
  local_98 = ptVar1 + (long)dVar18 * 2;
  ptVar13 = ptVar1 + (long)dVar18 * 2 + 4;
  local_58 = dVar18;
  ptVar11[-2] = 2.461252e-39;
  ptVar11[-1] = 0.0;
  mayer_realfft(iVar6,ptVar12);
  ptVar12 = local_60;
  local_a0 = uVar17;
  if (0 < npts) {
    uVar8 = 0;
    do {
      ptVar13[uVar8] = ptVar12[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar17 != uVar8);
  }
  dVar22 = local_58;
  lVar20 = local_68;
  ptVar15 = local_98;
  ptVar9 = local_98 + (long)local_58 + 4;
  uVar10 = (int)local_a0 - 1;
  if (2 < (int)local_a0) {
    ptVar16 = ptVar12 + local_68;
    lVar14 = 0;
    do {
      ptVar16 = ptVar16 + -1;
      ptVar1[(long)dVar22 * 3 + lVar14 + 9] = *ptVar16;
      lVar14 = lVar14 + 1;
    } while ((ulong)uVar10 - 1 != lVar14);
  }
  *(ulong *)(ptVar15 + 2) = *(ulong *)(ptVar15 + 5) << 0x20 | *(ulong *)(ptVar15 + 5) >> 0x20;
  *(ulong *)ptVar15 = *(ulong *)(ptVar15 + 7) << 0x20 | *(ulong *)(ptVar15 + 7) >> 0x20;
  uVar7 = local_44;
  ptVar15[(long)dVar22 + (long)(int)uVar10 + 8] = 0.0;
  local_40 = 0;
  ptVar15[(long)dVar22 + 8] = 0.0;
  tVar2 = ptVar15[(long)dVar22 + 9];
  tVar3 = ptVar15[(long)dVar22 + 10];
  tVar4 = ptVar15[(long)dVar22 + 0xb];
  *ptVar9 = -ptVar15[(long)dVar22 + 0xc];
  ptVar15[(long)dVar22 + 5] = -tVar4;
  ptVar15[(long)dVar22 + 6] = -tVar3;
  ptVar15[(long)dVar22 + 7] = -tVar2;
  uVar17 = (ulong)local_44;
  if ((int)local_44 < 1) {
    fVar27 = 0.0;
  }
  else {
    fVar27 = 0.0;
    uVar8 = 0;
    do {
      fVar21 = (ptVar12[(long)dVar22 * 2 + lVar20 + uVar8 + 5] -
               ptVar12[(long)dVar22 * 2 + lVar20 + uVar8 + 3]) *
               (ptVar12[(long)dVar22 * 2 + lVar20 + uVar8 + 5] -
               ptVar12[(long)dVar22 * 2 + lVar20 + uVar8 + 3]) +
               (ptVar12[(long)dVar22 * 3 + lVar20 + uVar8 + 9] -
               ptVar12[(long)dVar22 * 3 + lVar20 + uVar8 + 7]) *
               (ptVar12[(long)dVar22 * 3 + lVar20 + uVar8 + 9] -
               ptVar12[(long)dVar22 * 3 + lVar20 + uVar8 + 7]);
      ptVar1[(long)dVar18 + uVar8] = fVar21;
      if (1 < uVar8) {
        fVar27 = fVar27 + fVar21;
      }
      uVar8 = uVar8 + 1;
    } while (uVar17 != uVar8);
  }
  local_b0 = ptVar15 + (long)dVar22 + 8;
  (ptVar1 + (long)dVar18 + (long)(int)uVar7)[0] = 0.0;
  (ptVar1 + (long)dVar18 + (long)(int)uVar7)[1] = 0.0;
  *local_78 = (float)((double)fVar27 * 0.5 * local_70 * local_70);
  ptVar15 = ptVar12;
  if (0 < (int)local_48) {
    local_d0 = (ulong)local_48;
    local_40 = 0;
    local_a8 = ptVar13;
    local_80 = fVar27;
    local_d8 = (double)fVar27 * 1e-10;
    do {
      ptVar13 = local_a8;
      uVar10 = 0xffffffff;
      fVar27 = 0.0;
      if (2 < (int)uVar7) {
        uVar19 = 0xffffffff;
        uVar8 = 2;
        do {
          fVar21 = ptVar1[(long)dVar18 + uVar8];
          if (((fVar27 < fVar21) &&
              (ptVar12[lVar20 + uVar8] <= fVar21 && fVar21 != ptVar12[lVar20 + uVar8])) &&
             (fVar23 = (ptVar1[(long)dVar18 + (uVar8 - 2)] + ptVar1[(long)dVar18 + uVar8 + 2]) * 0.6
             , uVar10 = -(uint)(fVar23 < fVar21),
             fVar27 = (float)(~uVar10 & (uint)fVar27 | (uint)fVar21 & uVar10), fVar23 < fVar21)) {
            uVar19 = uVar8 & 0xffffffff;
          }
          uVar10 = (uint)uVar19;
          uVar8 = uVar8 + 1;
        } while (uVar17 != uVar8);
      }
      if (((local_80 <= 0.0) || ((double)fVar27 < local_d8)) || ((int)uVar10 < 0))
      goto LAB_001ad27a;
      iVar6 = uVar10 - 0x32;
      if ((int)uVar10 < 0x35) {
        iVar6 = 2;
      }
      uVar28 = uVar10 + 0x32;
      if ((int)(uVar10 + 0x32) <= (int)uVar7) {
        uVar28 = uVar7;
      }
      if (iVar6 < (int)uVar28) {
        uVar8 = 0x34;
        if (0x34 < (int)uVar10) {
          uVar8 = (ulong)uVar10;
        }
        uVar19 = uVar8 - 0x32;
        uVar7 = ((int)uVar8 - uVar10) - 0x32;
        do {
          fVar23 = (float)(int)uVar7;
          uVar7 = uVar7 + 1;
          fVar21 = fVar27 + fVar27;
          if (2 < uVar7) {
            fVar21 = (float)((double)fVar27 / ((double)(fVar23 * fVar23 * fVar23 * fVar23) + 1.0));
          }
          if (ptVar1[uVar19] <= fVar21 && fVar21 != ptVar1[uVar19]) {
            ptVar1[uVar19] = fVar21;
          }
          uVar19 = uVar19 + 1;
        } while (uVar28 != uVar19);
      }
      fVar27 = ptVar13[(ulong)uVar10 - 1];
      fVar21 = ptVar13[(ulong)uVar10 + 1];
      fVar31 = fVar21 - fVar27;
      fVar23 = local_b0[(ulong)uVar10 - 1];
      fVar5 = local_b0[(ulong)uVar10 + 1];
      fVar30 = fVar5 - fVar23;
      local_70 = (double)CONCAT44(local_70._4_4_,fVar30);
      local_78 = (t_float *)CONCAT44(local_78._4_4_,fVar31);
      fVar30 = fVar31 * fVar31 + fVar30 * fVar30;
      local_98 = (t_sample *)CONCAT44(local_98._4_4_,fVar30);
      fVar21 = ((fVar5 * fVar5 - fVar23 * fVar23) + (fVar21 * fVar21 - fVar27 * fVar27)) /
               (fVar30 + fVar30);
      fVar27 = 0.5;
      if ((fVar21 <= 0.5) && (fVar27 = fVar21, fVar21 < -0.5)) {
        fVar27 = -0.5;
      }
      local_68 = CONCAT44(local_68._4_4_,fVar27);
      local_58 = (double)(fVar27 * 3.1415927);
      ptVar11[-2] = 2.462566e-39;
      ptVar11[-1] = 0.0;
      local_e0 = sin((double)(fVar27 * 3.1415927));
      dVar22 = local_58;
      ptVar11[-2] = 2.462591e-39;
      ptVar11[-1] = 0.0;
      dVar22 = cos(dVar22);
      fVar21 = (float)dVar22;
      fVar27 = 1.0;
      uVar7 = 0;
      uVar28 = 0;
      uVar29 = 0;
      if (0.003 <= ABS((float)(local_58 + 1.5707963267948966))) {
        fVar27 = fVar21 / (float)(local_58 + 1.5707963267948966);
        uVar7 = in_XMM9_Db;
        uVar28 = in_XMM9_Dc;
        uVar29 = in_XMM9_Dd;
      }
      fVar23 = 1.0;
      uVar24 = 0;
      uVar25 = 0;
      uVar26 = 0;
      if (0.003 <= ABS((float)(local_58 + -1.5707963267948966))) {
        uVar24 = in_XMM9_Db ^ 0x80000000;
        uVar25 = in_XMM9_Dc ^ 0x80000000;
        uVar26 = in_XMM9_Dd ^ 0x80000000;
        fVar23 = -fVar21 / (float)(local_58 + -1.5707963267948966);
      }
      dVar22 = (double)(float)local_98;
      uStack_50 = in_XMM9_Dc;
      uStack_4c = in_XMM9_Dd;
      if (dVar22 < 0.0) {
        local_58 = (double)CONCAT44(in_XMM9_Db,fVar21);
        local_98 = (t_sample *)CONCAT44(uVar7,fVar27);
        local_f8 = fVar23;
        uStack_f4 = uVar24;
        uStack_f0 = uVar25;
        uStack_ec = uVar26;
        uStack_90 = uVar28;
        uStack_8c = uVar29;
        ptVar11[-2] = 2.462854e-39;
        ptVar11[-1] = 0.0;
        dVar22 = sqrt(dVar22);
        fVar27 = (float)local_98;
        fVar21 = (float)local_58;
        in_XMM9_Db = local_58._4_4_;
        fVar23 = local_f8;
      }
      else {
        dVar22 = SQRT(dVar22);
      }
      fVar27 = 1.0 / (fVar27 + fVar23);
      local_b8[local_40].p_freq =
           ((float)local_68 + (float)local_68 + (float)(int)uVar10) * local_34;
      local_b8[local_40].p_amp = (float)((double)fVar27 * dVar22) * local_84;
      local_b8[local_40].p_ampreal =
           (local_78._0_4_ * fVar21 - local_70._0_4_ * (float)local_e0) * fVar27 * local_84;
      local_b8[local_40].p_ampimag =
           (local_78._0_4_ * (float)local_e0 + local_70._0_4_ * fVar21) * fVar27 * local_84;
      local_40 = local_40 + 1;
      in_XMM9_Dc = uStack_50;
      in_XMM9_Dd = uStack_4c;
      uVar7 = local_44;
    } while (local_40 != local_d0);
    local_40 = (ulong)local_48;
    ptVar13 = local_a8;
  }
LAB_001ad27a:
  fVar27 = local_34;
  uVar17 = local_40;
  ptVar1 = local_b0;
  peaks = local_b8;
  iVar6 = (int)local_a0;
  npeak_00 = (int)local_40;
  ptVar11[-2] = 2.463296e-39;
  ptVar11[-1] = 0.0;
  loud_00 = (int)ptVar15;
  sigmund_tweak(iVar6,ptVar13,ptVar1,npeak_00,peaks,fVar27,loud_00);
  fVar27 = local_34;
  ptVar11[-2] = 2.46333e-39;
  ptVar11[-1] = 0.0;
  sigmund_tweak(iVar6,ptVar13,ptVar1,npeak_00,peaks,fVar27,loud_00);
  if (npeak_00 != 0) {
    lVar20 = 0;
    do {
      fVar27 = *(float *)((long)&peaks->p_freq + lVar20);
      fVar21 = -1500.0;
      if (0.0 < fVar27) {
        ptVar11[-2] = 2.463417e-39;
        ptVar11[-1] = 0.0;
        dVar18 = log((double)fVar27 * 0.12231220585);
        fVar21 = (float)(dVar18 * 17.3123405046);
      }
      *(float *)((long)&peaks->p_pit + lVar20) = fVar21;
      fVar27 = *(float *)((long)&peaks->p_amp + lVar20);
      fVar21 = 0.0;
      if (0.0 < fVar27) {
        ptVar11[-2] = 2.463481e-39;
        ptVar11[-1] = 0.0;
        dVar18 = log((double)fVar27);
        fVar27 = (float)(dVar18 * 4.3429448190326045 + 100.0);
        fVar21 = 0.0;
        if (0.0 <= fVar27) {
          fVar21 = fVar27;
        }
      }
      *(float *)((long)&peaks->p_db + lVar20) = fVar21;
      lVar20 = lVar20 + 0x20;
    } while ((uVar17 & 0xffffffff) << 5 != lVar20);
  }
  ptVar1 = local_60;
  uVar17 = local_c0;
  *local_c8 = npeak_00;
  if (399999 < (int)local_7c) {
    ptVar11[-2] = 2.4636e-39;
    ptVar11[-1] = 0.0;
    freebytes(ptVar1,uVar17);
  }
  return;
}

Assistant:

static void sigmund_getrawpeaks(int npts, t_float *insamps,
    int npeak, t_peak *peakv, int *nfound, t_float *power, t_float srate,
    int loud, t_float hifreq)
{
    t_float oneovern = 1.0/ (t_float)npts;
    t_float fperbin = 0.5 * srate * oneovern, totalpower = 0;
    int npts2 = 2*npts, i, bin, bufsize = sizeof (t_float ) *
        (2*NEGBINS + 6*npts);
    int peakcount = 0;
    t_float *fp1, *fp2;
    t_float *rawreal, *rawimag, *maskbuf, *powbuf;
    t_float *bigbuf = (t_float *)BUF_ALLOCA(bufsize);
    int maxbin = hifreq/fperbin;
    if (maxbin > npts - NEGBINS)
        maxbin = npts - NEGBINS;
    /* if (loud) post("tweak %d", tweak); */
    maskbuf = bigbuf + npts2;
    powbuf = maskbuf + npts;
    rawreal = powbuf + npts+NEGBINS;
    rawimag = rawreal+npts+NEGBINS;
    for (i = 0; i < npts; i++)
        maskbuf[i] = 0;

    for (i = 0; i < npts; i++)
        bigbuf[i] = insamps[i];
    for (i = npts; i < 2*npts; i++)
        bigbuf[i] = 0;
    mayer_realfft(npts2, bigbuf);
    for (i = 0; i < npts; i++)
        rawreal[i] = bigbuf[i];
    for (i = 1; i < npts-1; i++)
        rawimag[i] = bigbuf[npts2-i];
    rawreal[-1] = rawreal[1];
    rawreal[-2] = rawreal[2];
    rawreal[-3] = rawreal[3];
    rawreal[-4] = rawreal[4];
    rawimag[0] = rawimag[npts-1] = 0;
    rawimag[-1] = -rawimag[1];
    rawimag[-2] = -rawimag[2];
    rawimag[-3] = -rawimag[3];
    rawimag[-4] = -rawimag[4];
#if 1
    for (i = 0, fp1 = rawreal, fp2 = rawimag; i < maxbin; i++, fp1++, fp2++)
    {
        t_float x1 = fp1[1] - fp1[-1], x2 = fp2[1] - fp2[-1],
            p = powbuf[i] = x1*x1+x2*x2;
        if (i >= 2)
           totalpower += p;
    }
    powbuf[maxbin] = powbuf[maxbin+1] = 0;
    *power = 0.5 * totalpower *oneovern * oneovern;
#endif
    for (peakcount = 0; peakcount < npeak; peakcount++)
    {
        t_float pow1, maxpower = 0, windreal, windimag, windpower,
            detune, pidetune, sinpidetune, cospidetune, ampcorrect, ampout,
            ampoutreal, ampoutimag, freqout, powmask;
        int bestindex = -1;

        for (bin = 2, fp1 = rawreal+2, fp2 = rawimag+2;
            bin < maxbin; bin++, fp1++, fp2++)
        {
            pow1 = powbuf[bin];
            if (pow1 > maxpower && pow1 > maskbuf[bin])
            {
                t_float thresh = PEAKTHRESHFACTOR *
                    (powbuf[bin-2]+powbuf[bin+2]);
                if (pow1 > thresh)
                    maxpower = pow1, bestindex = bin;
            }
        }

        if (totalpower <= 0 || maxpower < 1e-10*totalpower || bestindex < 0)
            break;
        fp1 = rawreal+bestindex;
        fp2 = rawimag+bestindex;
        powmask = maxpower * PEAKMASKFACTOR;
        /* if (loud > 2)
            post("maxpower %f, powmask %f, param1 %f",
                maxpower, powmask, param1); */
        sigmund_remask(maxbin, bestindex, powmask, maxpower, maskbuf);
        
        /* if (loud > 1)
            post("best index %d, total power %f", bestindex, totalpower); */

        windreal = fp1[1] - fp1[-1];
        windimag = fp2[1] - fp2[-1];
        windpower = windreal * windreal + windimag * windimag;
        detune = ((fp1[1] * fp1[1] - fp1[-1]*fp1[-1]) 
            + (fp2[1] * fp2[1] - fp2[-1]*fp2[-1])) / (2 * windpower);

        if (detune > 0.5)
            detune = 0.5;
        else if (detune < -0.5)
            detune = -0.5;
        /* if (loud > 1)
            post("windpower %f, index %d, detune %f",
                windpower, bestindex, detune); */
        pidetune = PI * detune;
        sinpidetune = sin(pidetune);
        cospidetune = cos(pidetune);
        ampcorrect = 1.0 / window_mag(pidetune, cospidetune);

        ampout = ampcorrect *sqrt(windpower);
        ampoutreal = ampcorrect *
            (windreal * cospidetune - windimag * sinpidetune);
        ampoutimag = ampcorrect *
            (windreal * sinpidetune + windimag * cospidetune);

            /* the frequency is the sum of the bin frequency and detuning */

        peakv[peakcount].p_freq = (freqout = (bestindex + 2*detune)) * fperbin;
        peakv[peakcount].p_amp = oneovern * ampout;
        peakv[peakcount].p_ampreal = oneovern * ampoutreal;
        peakv[peakcount].p_ampimag = oneovern * ampoutimag;
    }
    sigmund_tweak(npts, rawreal, rawimag, peakcount, peakv, fperbin, loud);
    sigmund_tweak(npts, rawreal, rawimag, peakcount, peakv, fperbin, loud);
    for (i = 0; i < peakcount; i++)
    {
        peakv[i].p_pit = sigmund_ftom(peakv[i].p_freq);
        peakv[i].p_db = sigmund_powtodb(peakv[i].p_amp);
    }
    *nfound = peakcount;
    BUF_FREEA(bigbuf, bufsize);
}